

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_function_widget.cpp
# Opt level: O3

void __thiscall
tfnw::TransferFunctionWidget::get_colormapf
          (TransferFunctionWidget *this,vector<float,_std::allocator<float>_> *color,
          vector<float,_std::allocator<float>_> *opacity)

{
  pointer puVar1;
  pointer pfVar2;
  ulong uVar3;
  pointer pfVar4;
  ulong uVar5;
  
  this->colormap_changed = false;
  std::vector<float,_std::allocator<float>_>::resize
            (color,((ulong)((long)(this->current_colormap).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->current_colormap).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2) * 3);
  std::vector<float,_std::allocator<float>_>::resize
            (opacity,(ulong)((long)(this->current_colormap).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->current_colormap).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
  puVar1 = (this->current_colormap).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->current_colormap).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (3 < uVar3) {
    pfVar4 = (color->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start + 2;
    pfVar2 = (opacity->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      pfVar4[-2] = (float)puVar1[uVar5 * 4] / 255.0;
      pfVar4[-1] = (float)puVar1[uVar5 * 4 + 1] / 255.0;
      *pfVar4 = (float)puVar1[uVar5 * 4 + 2] / 255.0;
      pfVar2[uVar5] = (float)puVar1[uVar5 * 4 + 3] / 255.0;
      uVar5 = uVar5 + 1;
      pfVar4 = pfVar4 + 3;
    } while (uVar3 >> 2 != uVar5);
  }
  return;
}

Assistant:

void TransferFunctionWidget::get_colormapf(std::vector<float> &color,
                                           std::vector<float> &opacity)
{
    colormap_changed = false;
    color.resize((current_colormap.size() / 4) * 3);
    opacity.resize(current_colormap.size() / 4);
    for (size_t i = 0; i < current_colormap.size() / 4; ++i) {
        color[i * 3] = current_colormap[i * 4] / 255.f;
        color[i * 3 + 1] = current_colormap[i * 4 + 1] / 255.f;
        color[i * 3 + 2] = current_colormap[i * 4 + 2] / 255.f;
        opacity[i] = current_colormap[i * 4 + 3] / 255.f;
    }
}